

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
* CoreML::enumeratedShapesOf
            (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *__return_storage_ptr__,ArrayFeatureType *params)

{
  int iVar1;
  int iVar2;
  ArrayFeatureType_EnumeratedShapes *pAVar3;
  ArrayFeatureType_Shape *pAVar4;
  int64_t local_58;
  int local_4c;
  undefined1 local_48 [4];
  int d;
  vector<long,_std::allocator<long>_> shape;
  int local_20;
  int i;
  ArrayFeatureType *params_local;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *shapes;
  
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(__return_storage_ptr__);
  local_20 = 0;
  while( true ) {
    pAVar3 = Specification::ArrayFeatureType::enumeratedshapes(params);
    iVar1 = Specification::ArrayFeatureType_EnumeratedShapes::shapes_size(pAVar3);
    if (iVar1 <= local_20) break;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)local_48);
    local_4c = 0;
    while( true ) {
      iVar1 = local_4c;
      pAVar3 = Specification::ArrayFeatureType::enumeratedshapes(params);
      pAVar4 = Specification::ArrayFeatureType_EnumeratedShapes::shapes(pAVar3,local_20);
      iVar2 = Specification::ArrayFeatureType_Shape::shape_size(pAVar4);
      if (iVar2 <= iVar1) break;
      pAVar3 = Specification::ArrayFeatureType::enumeratedshapes(params);
      pAVar4 = Specification::ArrayFeatureType_EnumeratedShapes::shapes(pAVar3,local_20);
      local_58 = Specification::ArrayFeatureType_Shape::shape(pAVar4,local_4c);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)local_48,&local_58);
      local_4c = local_4c + 1;
    }
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_48);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_48);
    local_20 = local_20 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::vector<int64_t>> enumeratedShapesOf(const Specification::ArrayFeatureType &params) {
        std::vector<std::vector<int64_t>> shapes;
        for (int i=0; i<params.enumeratedshapes().shapes_size(); i++) {
            std::vector<int64_t> shape;
            for (int d=0; d<params.enumeratedshapes().shapes(i).shape_size(); d++) {
                shape.push_back((int64_t)params.enumeratedshapes().shapes(i).shape(d));
            }
            shapes.push_back(shape);
        }
        return shapes;
    }